

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.cpp
# Opt level: O0

void __thiscall
CChromeTracer::writeCallLogging
          (CChromeTracer *this,char *name,uint64_t threadId,uint64_t startTime,uint64_t delta,
          uint64_t id)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar4 [16];
  int size_1;
  int size;
  undefined4 uVar3;
  
  uVar3 = (undefined4)((ulong)in_RCX >> 0x20);
  auVar1._8_4_ = uVar3;
  auVar1._0_8_ = in_RCX;
  auVar1._12_4_ = 0x45300000;
  auVar4._8_4_ = (int)((ulong)in_R8 >> 0x20);
  auVar4._0_8_ = in_R8;
  auVar4._12_4_ = 0x45300000;
  snprintf((char *)(in_RDI + 0x240),0x4000,
           "{\"ph\":\"X\",\"pid\":%lu,\"tid\":%lu,\"name\":\"%s\",\"ts\":%.3f,\"dur\":%.3f,\"args\":{\"id\":%lu}},\n"
           ,((auVar1._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)in_RCX) - 4503599627370496.0)) / 1000.0,
           ((auVar4._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)in_R8) - 4503599627370496.0)) / 1000.0,
           *(undefined8 *)(in_RDI + 0x30),in_RDX,in_RSI);
  std::ostream::write((char *)(in_RDI + 0x40),in_RDI + 0x240);
  if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
    auVar2._8_4_ = uVar3;
    auVar2._0_8_ = in_RCX;
    auVar2._12_4_ = 0x45300000;
    snprintf((char *)(in_RDI + 0x240),0x4000,
             "{\"ph\":\"s\",\"pid\":%lu,\"tid\":%lu,\"name\":\"Command\",\"cat\":\"Commands\",\"ts\":%.3f,\"id\":%lu},\n"
             ,((auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)in_RCX) - 4503599627370496.0)) / 1000.0,
             *(undefined8 *)(in_RDI + 0x30),in_RDX,in_R9);
    std::ostream::write((char *)(in_RDI + 0x40),in_RDI + 0x240);
  }
  return;
}

Assistant:

void CChromeTracer::writeCallLogging(
    const char* name,
    uint64_t threadId,
    uint64_t startTime,
    uint64_t delta,
    uint64_t id )
{
    int size = CLI_SPRINTF(m_StringBuffer, CLI_STRING_BUFFER_SIZE,
        "{\"ph\":\"X\",\"pid\":%" PRIu64 ",\"tid\":%" PRIu64 ",\"name\":\"%s\""
        ",\"ts\":%.3f,\"dur\":%.3f,\"args\":{\"id\":%" PRIu64 "}},\n",
        m_ProcessId,
        threadId,
        name,
        startTime / 1000.0,
        delta / 1000.0,
        id );
    m_TraceFile.write(m_StringBuffer, size);

    if( m_AddFlowEvents )
    {
        int size = CLI_SPRINTF(m_StringBuffer, CLI_STRING_BUFFER_SIZE,
            "{\"ph\":\"s\",\"pid\":%" PRIu64 ",\"tid\":%" PRIu64 ",\"name\":\"Command\""
            ",\"cat\":\"Commands\",\"ts\":%.3f,\"id\":%" PRIu64 "},\n",
            m_ProcessId,
            threadId,
            startTime / 1000.0,
            id );
        m_TraceFile.write(m_StringBuffer, size);
    }
}